

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

int __thiscall
cnn::LookupParameters::copy(LookupParameters *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  bool bVar1;
  Tensor *pTVar2;
  size_t i;
  Dim *in_stack_ffffffffffffffc8;
  Tensor *v_src;
  Tensor *local_18;
  
  bVar1 = operator==(in_stack_ffffffffffffffc8,(Dim *)0x51d18a);
  if (!bVar1) {
    __assert_fail("dim == param.dim",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/model.cc"
                  ,0x8f,"void cnn::LookupParameters::copy(const LookupParameters &)");
  }
  local_18 = (Tensor *)0x0;
  while( true ) {
    v_src = local_18;
    pTVar2 = (Tensor *)
             std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::size
                       ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)(dst + 0x30));
    if (pTVar2 <= v_src) break;
    std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
              (&this->values,(size_type)local_18);
    std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
              ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)(dst + 0x30),(size_type)local_18
              );
    TensorTools::CopyElements((Tensor *)this,v_src);
    local_18 = (Tensor *)((long)(local_18->d).d + 1);
  }
  return (int)v_src;
}

Assistant:

void LookupParameters::copy(const LookupParameters & param) {
  assert(dim == param.dim);
  for(size_t i = 0; i < param.values.size(); ++i)
    TensorTools::CopyElements(values[i], param.values[i]);
}